

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwio.c
# Opt level: O2

void png_set_write_fn(png_structrp png_ptr,png_voidp io_ptr,png_rw_ptr write_data_fn,
                     png_flush_ptr output_flush_fn)

{
  code *pcVar1;
  code *pcVar2;
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->io_ptr = io_ptr;
    pcVar1 = png_default_write_data;
    if (write_data_fn != (png_rw_ptr)0x0) {
      pcVar1 = write_data_fn;
    }
    pcVar2 = png_default_flush;
    if (output_flush_fn != (png_flush_ptr)0x0) {
      pcVar2 = output_flush_fn;
    }
    png_ptr->write_data_fn = pcVar1;
    png_ptr->output_flush_fn = pcVar2;
    if (png_ptr->read_data_fn != (png_rw_ptr)0x0) {
      png_ptr->read_data_fn = (png_rw_ptr)0x0;
      png_warning(png_ptr,"Can\'t set both read_data_fn and write_data_fn in the same structure");
      return;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_write_fn(png_structrp png_ptr, png_voidp io_ptr,
    png_rw_ptr write_data_fn, png_flush_ptr output_flush_fn)
{
   if (png_ptr == NULL)
      return;

   png_ptr->io_ptr = io_ptr;

#ifdef PNG_STDIO_SUPPORTED
   if (write_data_fn != NULL)
      png_ptr->write_data_fn = write_data_fn;

   else
      png_ptr->write_data_fn = png_default_write_data;
#else
   png_ptr->write_data_fn = write_data_fn;
#endif

#ifdef PNG_WRITE_FLUSH_SUPPORTED
#  ifdef PNG_STDIO_SUPPORTED

   if (output_flush_fn != NULL)
      png_ptr->output_flush_fn = output_flush_fn;

   else
      png_ptr->output_flush_fn = png_default_flush;

#  else
   png_ptr->output_flush_fn = output_flush_fn;
#  endif
#else
   PNG_UNUSED(output_flush_fn)
#endif /* WRITE_FLUSH */

#ifdef PNG_READ_SUPPORTED
   /* It is an error to read while writing a png file */
   if (png_ptr->read_data_fn != NULL)
   {
      png_ptr->read_data_fn = NULL;

      png_warning(png_ptr,
          "Can't set both read_data_fn and write_data_fn in the"
          " same structure");
   }
#endif
}